

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderIntegerFunctionTests.cpp
# Opt level: O1

bool __thiscall
vkt::shaderexecutor::BitCountCaseInstance::compare
          (BitCountCaseInstance *this,void **inputs,void **outputs)

{
  char cVar1;
  int iVar2;
  pointer pSVar3;
  int iVar4;
  ostream *poVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  ostringstream *this_00;
  long lVar11;
  
  pSVar3 = (this->super_IntegerFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  cVar1 = (&DAT_00b87d58)[(ulong)*(uint *)((long)&(pSVar3->varType).m_data + 4) * 4];
  iVar4 = glu::getDataTypeScalarSize((pSVar3->varType).m_data.basic.type);
  bVar6 = iVar4 < 1;
  if (0 < iVar4) {
    lVar11 = 0;
    do {
      uVar7 = *(uint *)((long)*inputs + lVar11 * 4);
      iVar2 = *(int *)((long)*outputs + lVar11 * 4);
      uVar9 = uVar7 & (2 << (cVar1 - 1U & 0x1f)) - 1U;
      uVar9 = (uVar9 >> 1 & 0x55555555) + (uVar9 & 0x55555555);
      uVar9 = (uVar9 >> 2 & 0x33333333) + (uVar9 & 0x33333333);
      uVar9 = (uVar9 >> 4 & 0x7070707) + (uVar9 & 0x7070707);
      uVar9 = (uVar9 >> 8 & 0xf000f) + (uVar9 & 0xf000f);
      iVar10 = (uVar9 >> 0x10) + (uVar9 & 0xff);
      uVar7 = (uVar7 >> 1 & 0x55555555) + (uVar7 & 0x55555555);
      uVar7 = (uVar7 >> 2 & 0x33333333) + (uVar7 & 0x33333333);
      uVar7 = (uVar7 >> 4 & 0x7070707) + (uVar7 & 0x7070707);
      uVar7 = (uVar7 >> 8 & 0xf000f) + (uVar7 & 0xf000f);
      iVar8 = (uVar7 >> 0x10) + (uVar7 & 0xff);
      if ((iVar8 < iVar2) || (iVar2 < iVar10)) {
        this_00 = &(this->super_IntegerFunctionTestInstance).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Expected [",10);
        poVar5 = (ostream *)std::ostream::operator<<(this_00,(int)lVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] in range [",0xc);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]",1);
        return bVar6;
      }
      lVar11 = lVar11 + 1;
      bVar6 = iVar4 <= (int)lVar11;
    } while (iVar4 != (int)lVar11);
  }
  return bVar6;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				integerLength	= getShaderUintBitCount(m_shaderType, precision);
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const deUint32			countMask		= getLowBitMask(integerLength);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const deUint32	value	= ((const deUint32*)inputs[0])[compNdx];
			const int		out		= ((const int*)outputs[0])[compNdx];
			const int		minRef	= dePop32(value&countMask);
			const int		maxRef	= dePop32(value);

			if (!de::inRange(out, minRef, maxRef))
			{
				m_failMsg << "Expected [" << compNdx << "] in range [" << minRef << ", " << maxRef << "]";
				return false;
			}
		}

		return true;
	}